

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

void arena_reset_finish_background_thread(tsd_t *tsd,uint arena_ind)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  background_thread_info_t *pbVar3;
  int iVar4;
  ulong uVar5;
  pthread_mutex_t *__mutex;
  
  pbVar3 = background_thread_info;
  if ((background_thread_enabled_state.repr & 1U) != 0) {
    uVar5 = (ulong)arena_ind % max_background_threads;
    __mutex = (pthread_mutex_t *)((long)&background_thread_info[uVar5].mtx.field_0 + 0x40);
    iVar4 = pthread_mutex_trylock(__mutex);
    if (iVar4 != 0) {
      malloc_mutex_lock_slow(&pbVar3[uVar5].mtx);
      pbVar3[uVar5].mtx.field_0.field_0.locked.repr = true;
    }
    puVar1 = &pbVar3[uVar5].mtx.field_0.field_0.prof_data.n_lock_ops;
    *puVar1 = *puVar1 + 1;
    if (&(pbVar3[uVar5].mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
      pbVar3[uVar5].mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
      ppwVar2 = &pbVar3[uVar5].mtx.field_0.witness.link.qre_prev;
      *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
    }
    pbVar3[uVar5].state = background_thread_started;
    pbVar3[uVar5].mtx.field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
  }
  background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&background_thread_lock.field_0 + 0x40));
  return;
}

Assistant:

static void
arena_reset_finish_background_thread(tsd_t *tsd, unsigned arena_ind) {
	if (have_background_thread) {
		if (background_thread_enabled()) {
			background_thread_info_t *info =
			    background_thread_info_get(arena_ind);
			assert(info->state == background_thread_paused);
			malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
			info->state = background_thread_started;
			malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
		}
		malloc_mutex_unlock(tsd_tsdn(tsd), &background_thread_lock);
	}
}